

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O1

aiTexture * __thiscall aiScene::GetEmbeddedTexture(aiScene *this,char *filename)

{
  uint uVar1;
  int iVar2;
  char *__s2;
  char *__s1;
  ulong uVar3;
  aiTexture *paVar4;
  
  if (*filename == '*') {
    uVar1 = atoi(filename + 1);
    paVar4 = (aiTexture *)0x0;
    if ((-1 < (int)uVar1) && (uVar1 < this->mNumTextures)) {
      paVar4 = this->mTextures[uVar1];
    }
  }
  else {
    __s2 = GetShortFilename(filename);
    if (this->mNumTextures != 0) {
      uVar3 = 0;
      do {
        __s1 = GetShortFilename((this->mTextures[uVar3]->mFilename).data);
        iVar2 = strcmp(__s1,__s2);
        if (iVar2 == 0) {
          return this->mTextures[uVar3];
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->mNumTextures);
    }
    paVar4 = (aiTexture *)0x0;
  }
  return paVar4;
}

Assistant:

const aiTexture* GetEmbeddedTexture(const char* filename) const {
        // lookup using texture ID (if referenced like: "*1", "*2", etc.)
        if ('*' == *filename) {
            int index = std::atoi(filename + 1);
            if (0 > index || mNumTextures <= static_cast<unsigned>(index))
                return nullptr;
            return mTextures[index];
        }
        // lookup using filename
        const char* shortFilename = GetShortFilename(filename);
        for (unsigned int i = 0; i < mNumTextures; i++) {
            const char* shortTextureFilename = GetShortFilename(mTextures[i]->mFilename.C_Str());
            if (strcmp(shortTextureFilename, shortFilename) == 0) {
                return mTextures[i];
            }
        }
        return nullptr;
    }